

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<std::complex<float>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator+=
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *rhs)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  long lVar4;
  long lVar5;
  int64_t j;
  long lVar6;
  int64_t i;
  long lVar7;
  
  lVar4 = rhs->size_;
  if (lVar4 == this->size_) {
    lVar5 = 0;
    for (lVar6 = 0; lVar6 < lVar4; lVar6 = lVar6 + 1) {
      for (lVar7 = 0; lVar7 < lVar4; lVar7 = lVar7 + 1) {
        pcVar3 = (this->data_)._M_t.
                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
        _Var1 = *(_ComplexT *)
                 ((long)&(rhs->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[lVar7].
                         _M_value + rhs->size_ * lVar5);
        _Var2 = *(_ComplexT *)((long)&pcVar3[lVar7]._M_value + lVar4 * lVar5);
        *(_ComplexT *)((long)&pcVar3[lVar7]._M_value + lVar4 * lVar5) =
             CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
        lVar4 = this->size_;
      }
      lVar5 = lVar5 + 8;
    }
    return this;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x98,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<float>>::operator+=(const SquareMatrix<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator+=( const SquareMatrix< T >& rhs ) {
          assert( rhs.size() == size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              (*this)(i,j) += rhs(i,j) ;
            }
          }
          return *this ;
        }